

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O1

QSize __thiscall QRadioButton::sizeHint(QRadioButton *this)

{
  long lVar1;
  Representation RVar2;
  char cVar3;
  QStyle *pQVar4;
  QSize QVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QSize sz;
  QStyleOptionButton opt;
  QString local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  QFontMetrics local_b8 [8];
  undefined8 local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  QSize QStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if ((*(int *)(lVar1 + 0x2ac) < 0) || (*(int *)(lVar1 + 0x2b0) < 0)) {
    QWidget::ensurePolished((QWidget *)this);
    local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_40 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)local_a8);
    (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))
              (this,(QStyleOptionButton *)local_a8);
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QWidget::style((QWidget *)this);
    QFontMetrics::QFontMetrics(local_b8,&((this->super_QAbstractButton).super_QWidget.data)->fnt);
    local_c8 = 0;
    uStack_c0 = 0xffffffffffffffff;
    QAbstractButton::text(&local_e0,&this->super_QAbstractButton);
    auVar6 = (**(code **)(*(long *)pQVar4 + 0x88))(pQVar4,local_b8,&local_c8,0x800,0,&local_e0);
    local_b0 = (undefined1 *)
               CONCAT44((auVar6._12_4_ - auVar6._4_4_) + 1,(auVar6._8_4_ - auVar6._0_4_) + 1);
    if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,0x10);
      }
    }
    QFontMetrics::~QFontMetrics(local_b8);
    cVar3 = QIcon::isNull();
    if (cVar3 == '\0') {
      RVar2.m_i = QStack_40.ht.m_i;
      if (QStack_40.ht.m_i < local_b0._4_4_) {
        RVar2.m_i = local_b0._4_4_;
      }
      local_b0 = (undefined1 *)CONCAT44(RVar2.m_i,QStack_40.wd.m_i + (int)local_b0 + 4);
    }
    pQVar4 = QWidget::style((QWidget *)this);
    QVar5 = (QSize)(**(code **)(*(long *)pQVar4 + 0xe8))(pQVar4,2,local_a8,&local_b0,this);
    *(QSize *)(lVar1 + 0x2ac) = QVar5;
    QIcon::~QIcon(&local_48);
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_60,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_a8);
  }
  else {
    QVar5 = *(QSize *)(lVar1 + 0x2ac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QSize QRadioButton::sizeHint() const
{
    Q_D(const QRadioButton);
    if (d->sizeHint.isValid())
        return d->sizeHint;
    ensurePolished();
    QStyleOptionButton opt;
    initStyleOption(&opt);
    QSize sz = style()->itemTextRect(fontMetrics(), QRect(), Qt::TextShowMnemonic,
                                     false, text()).size();
    if (!opt.icon.isNull())
        sz = QSize(sz.width() + opt.iconSize.width() + 4, qMax(sz.height(), opt.iconSize.height()));
    d->sizeHint = style()->sizeFromContents(QStyle::CT_RadioButton, &opt, sz, this);
    return d->sizeHint;
}